

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 fill_col;
  byte bVar5;
  byte bVar6;
  undefined7 in_register_00000031;
  int idx;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool hovered;
  bool held;
  ImVec2 label_size;
  bool local_ae;
  bool local_ad;
  ImGuiID local_ac;
  undefined4 local_a8;
  float local_a4;
  ImRect local_a0;
  ImVec2 local_90;
  undefined1 local_88 [16];
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImRect local_40;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_a8 = (undefined4)CONCAT71(in_register_00000031,selected);
  local_ac = ImGuiWindow::GetID(this,label,(char *)0x0);
  local_60 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar11 = (*size_arg).x;
  fVar10 = (*size_arg).y;
  uVar8 = -(uint)(fVar11 != 0.0);
  uVar9 = -(uint)(fVar10 != 0.0);
  local_90.x = (float)(~uVar8 & (uint)local_60.x | (uint)fVar11 & uVar8);
  local_90.y = (float)(~uVar9 & (uint)local_60.y | (uint)fVar10 & uVar9);
  local_a4 = (this->DC).CursorPos.x;
  local_88 = ZEXT416((uint)((this->DC).CursorPos.y + (this->DC).CurrLineTextBaseOffset));
  local_58 = local_60;
  ItemSize(&local_90,0.0);
  local_a0.Min.x = local_a4;
  if ((flags & 2U) != 0) {
    local_a0.Min.x = (this->ParentWorkRect).Min.x;
  }
  if ((((uint)flags >> 0x18 & 1) != 0) || ((size_arg->x == 0.0 && (!NAN(size_arg->x))))) {
    fVar11 = (&(this->WorkRect).Max)[flags & 2].x - local_a0.Min.x;
    uVar8 = -(uint)(fVar11 <= local_58.x);
    local_90.x = (float)(uVar8 & (uint)local_58.x | ~uVar8 & (uint)fVar11);
  }
  local_70.x = local_a4;
  local_70.y = (float)local_88._0_4_;
  local_68.x = local_90.x + local_a0.Min.x;
  local_68.y = local_90.y + (float)local_88._0_4_;
  local_a0.Min.y = (float)local_88._0_4_;
  local_a0.Max = local_68;
  if (((uint)flags >> 0x1b & 1) == 0) {
    fVar11 = 0.0;
    if ((flags & 2U) == 0) {
      fVar11 = (pIVar3->Style).ItemSpacing.x;
    }
    fVar10 = (pIVar3->Style).ItemSpacing.y;
    fVar12 = (float)(int)(fVar10 * 0.5);
    local_a0.Min.x = local_a0.Min.x - (float)(int)(fVar11 * 0.5);
    local_a0.Min.y = (float)local_88._0_4_ - fVar12;
    local_a0.Max.y = local_68.y + (fVar10 - fVar12);
    local_a0.Max.x = local_68.x + (fVar11 - (float)(int)(fVar11 * 0.5));
  }
  local_88._0_4_ = (this->ClipRect).Min.x;
  local_a4 = (this->ClipRect).Max.x;
  if ((flags & 2U) != 0) {
    fVar11 = (this->ParentWorkRect).Max.x;
    (this->ClipRect).Min.x = (this->ParentWorkRect).Min.x;
    (this->ClipRect).Max.x = fVar11;
  }
  bVar4 = ItemAdd(&local_a0,local_ac,(ImRect *)0x0,(flags & 8U) >> 1);
  if ((flags & 2U) != 0) {
    (this->ClipRect).Min.x = (float)local_88._0_4_;
    (this->ClipRect).Max.x = local_a4;
  }
  if (!bVar4) {
    return false;
  }
  bVar5 = (byte)((pIVar3->CurrentItemFlags & 4U) >> 2) | (flags & 8U) == 0;
  local_a4 = (float)(uint)bVar5;
  if (bVar5 == 0) {
    BeginDisabled(true);
  }
  if ((flags & 2U) != 0) {
    if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
      if (pIVar3->CurrentTable != (ImGuiTable *)0x0) {
        TablePushBackgroundChannel();
      }
    }
    else {
      PushColumnsBackground();
    }
  }
  local_88._0_8_ = label;
  uVar9 = (uint)flags >> 0x10 & 0x80;
  uVar8 = uVar9 + 0x120;
  if ((flags & 4U) == 0) {
    uVar8 = uVar9;
  }
  bVar4 = ButtonBehavior(&local_a0,local_ac,&local_ae,&local_ad,
                         (flags & 0x10U) << 8 |
                         uVar8 + ((uint)flags >> 0x12 & 0x10 | (uint)flags >> 3 & 0x20000));
  bVar5 = (byte)local_a8;
  if ((((uint)flags >> 0x15 & 1) != 0) && (pIVar3->NavJustMovedToId != 0)) {
    bVar7 = pIVar3->NavJustMovedToId == local_ac &&
            pIVar3->NavJustMovedToFocusScopeId == (this->DC).NavFocusScopeIdCurrent;
    bVar4 = bVar4 || bVar7;
    bVar5 = bVar7 | bVar5;
  }
  bVar7 = true;
  if ((bVar4 != false) || ((bVar7 = false, ((uint)flags >> 0x1a & 1) != 0 && (local_ae != false))))
  {
    if ((pIVar3->NavDisableMouseHover == false) &&
       ((pIVar3->NavWindow == this && (pIVar3->NavLayer == (this->DC).NavLayerCurrent)))) {
      IVar2 = (this->DC).CursorStartPos;
      fVar11 = IVar2.x;
      local_40.Min.x = local_a0.Min.x - fVar11;
      fVar10 = IVar2.y;
      local_40.Min.y = local_a0.Min.y - fVar10;
      local_40.Max.y = local_a0.Max.y - fVar10;
      local_40.Max.x = local_a0.Max.x - fVar11;
      SetNavID(local_ac,pIVar3->NavLayer,(this->DC).NavFocusScopeIdCurrent,&local_40);
      pIVar3->NavDisableHighlight = true;
    }
    if (bVar7 == false) {
      bVar7 = false;
    }
    else {
      MarkItemEdited(local_ac);
      bVar7 = true;
    }
  }
  bVar6 = (byte)local_a8;
  if ((flags & 0x10U) != 0) {
    SetItemAllowOverlap();
    bVar6 = (byte)local_a8;
  }
  if (bVar5 != bVar6) {
    pIVar1 = &(pIVar3->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (((uint)flags >> 0x19 & 1) == 0 || local_ad != true) {
    if (((bVar5 | local_ae) & 1) == 0) goto LAB_00145296;
    idx = 0x18;
    if ((local_ae & 1U) != 0) {
      idx = local_ad + 0x19;
    }
  }
  else {
    local_ae = true;
    idx = local_ad + 0x19;
  }
  fill_col = GetColorU32(idx,1.0);
  IVar2.y = local_a0.Min.y;
  IVar2.x = local_a0.Min.x;
  RenderFrame(IVar2,local_a0.Max,fill_col,false,0.0);
LAB_00145296:
  RenderNavHighlight(&local_a0,local_ac,10);
  if ((flags & 2U) != 0) {
    if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
      if (pIVar3->CurrentTable != (ImGuiTable *)0x0) {
        TablePopBackgroundChannel();
      }
    }
    else {
      PopColumnsBackground();
    }
  }
  RenderTextClipped(&local_70,&local_68,(char *)local_88._0_8_,(char *)0x0,&local_60,
                    &(pIVar3->Style).SelectableTextAlign,&local_a0);
  if ((((bVar7 != false) && ((flags & 1U) == 0)) && ((this->Flags & 0x4000000U) != 0)) &&
     (((pIVar3->LastItemData).InFlags & 0x20) == 0)) {
    CloseCurrentPopup();
  }
  if (local_a4._0_1_ == '\0') {
    EndDisabled();
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}